

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O1

uint trad_enc_encrypt_update
               (trad_enc_ctx *ctx,uint8_t *in,size_t in_len,uint8_t *out,size_t out_len)

{
  byte c;
  uint uVar1;
  ulong uVar2;
  
  if (in_len < out_len) {
    out_len = in_len;
  }
  if ((int)out_len == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      c = in[uVar2];
      uVar1 = ctx->keys[2] | 2;
      out[uVar2] = (byte)((uVar1 ^ 1) * uVar1 >> 8) ^ c;
      trad_enc_update_keys(ctx,c);
      uVar2 = uVar2 + 1;
    } while ((out_len & 0xffffffff) != uVar2);
  }
  return (uint)uVar2;
}

Assistant:

static unsigned
trad_enc_encrypt_update(struct trad_enc_ctx *ctx, const uint8_t *in,
    size_t in_len, uint8_t *out, size_t out_len)
{
	unsigned i, max;

	max = (unsigned)((in_len < out_len)? in_len: out_len);

	for (i = 0; i < max; i++) {
		uint8_t t = in[i];
		out[i] = t ^ trad_enc_decypt_byte(ctx);
		trad_enc_update_keys(ctx, t);
	}
	return i;
}